

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Type.cpp
# Opt level: O2

string * __thiscall
soul::Type::getDescription
          (string *__return_storage_ptr__,Type *this,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_soul::Structure_&)>
          *getStructName)

{
  Category CVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  BoundedIntSize BVar3;
  char *pcVar4;
  ArraySize AVar5;
  Structure *__args;
  string *this_00;
  string sStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  string local_58;
  Type local_38;
  
  if (this->isConstant == true) {
    removeConst((Type *)&local_98,this);
    getDescription(&sStack_b8,(Type *)&local_98,getStructName);
    std::operator+(__return_storage_ptr__,"const ",&sStack_b8);
LAB_001e5904:
    std::__cxx11::string::~string((string *)&sStack_b8);
    pbVar2 = &local_98;
LAB_001e5911:
    RefCountedPtr<soul::Structure>::~RefCountedPtr
              ((RefCountedPtr<soul::Structure> *)&(pbVar2->field_2)._M_allocated_capacity);
    return __return_storage_ptr__;
  }
  if (this->isRef == true) {
    removeReference((Type *)&local_98,this);
    getDescription(&sStack_b8,(Type *)&local_98,getStructName);
    std::operator+(__return_storage_ptr__,&sStack_b8,"&");
    goto LAB_001e5904;
  }
  CVar1 = this->category;
  if (CVar1 == vector) {
    pcVar4 = PrimitiveType::getDescription(&this->primitiveType);
    AVar5 = getVectorSize(this);
    std::__cxx11::to_string(&local_78,AVar5);
    std::operator+(&local_98,"<",&local_78);
    std::operator+(&sStack_b8,&local_98,">");
    std::operator+(__return_storage_ptr__,pcVar4,&sStack_b8);
    std::__cxx11::string::~string((string *)&sStack_b8);
    std::__cxx11::string::~string((string *)&local_98);
    this_00 = &local_78;
    goto LAB_001e59a2;
  }
  if ((CVar1 == array) && (this->boundingSize == 0)) {
    getArrayElementType((Type *)&local_98,this);
    getDescription(&sStack_b8,(Type *)&local_98,getStructName);
    std::operator+(__return_storage_ptr__,&sStack_b8,"[]");
    goto LAB_001e5904;
  }
  if (CVar1 == array) {
    getArrayElementType(&local_38,this);
    getDescription(&sStack_b8,&local_38,getStructName);
    AVar5 = getArraySize(this);
    std::__cxx11::to_string(&local_58,AVar5);
    std::operator+(&local_78,"[",&local_58);
    std::operator+(&local_98,&local_78,"]");
    std::operator+(__return_storage_ptr__,&sStack_b8,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&sStack_b8);
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38;
    goto LAB_001e5911;
  }
  switch(CVar1) {
  case wrap:
    BVar3 = getBoundedIntLimit(this);
    std::__cxx11::to_string(&local_98,BVar3);
    std::operator+(&sStack_b8,"wrap<",&local_98);
    std::operator+(__return_storage_ptr__,&sStack_b8,">");
    break;
  case clamp:
    BVar3 = getBoundedIntLimit(this);
    std::__cxx11::to_string(&local_98,BVar3);
    std::operator+(&sStack_b8,"clamp<",&local_98);
    std::operator+(__return_storage_ptr__,&sStack_b8,">");
    break;
  case structure:
    __args = getStructRef(this);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_soul::Structure_&)>
    ::operator()(__return_storage_ptr__,getStructName,__args);
    return __return_storage_ptr__;
  case stringLiteral:
    pcVar4 = "string";
    goto LAB_001e5b80;
  default:
    pcVar4 = PrimitiveType::getDescription(&this->primitiveType);
LAB_001e5b80:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar4,(allocator<char> *)&sStack_b8);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)&sStack_b8);
  this_00 = &local_98;
LAB_001e59a2:
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

std::string Type::getDescription (const std::function<std::string(const Structure&)>& getStructName) const
{
    if (isConst())          return "const " + removeConst().getDescription (getStructName);
    if (isReference())      return removeReference().getDescription (getStructName) + "&";
    if (isVector())         return primitiveType.getDescription() + ("<" + std::to_string (getVectorSize()) + ">");
    if (isUnsizedArray())   return getArrayElementType().getDescription (getStructName) + ("[]");
    if (isArray())          return getArrayElementType().getDescription (getStructName) + ("[" + std::to_string (getArraySize()) + "]");
    if (isWrapped())        return "wrap<" + std::to_string (getBoundedIntLimit()) + ">";
    if (isClamped())        return "clamp<" + std::to_string (getBoundedIntLimit()) + ">";
    if (isStruct())         return getStructName (getStructRef());
    if (isStringLiteral())  return "string";

    return primitiveType.getDescription();
}